

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

EncodedCharPtr __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::FScanNumber
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr p,double *pdbl,
          LikelyNumberType *likelyType,size_t savedMultiUnits)

{
  code *pcVar1;
  size_t likelyNumberType;
  double *psz;
  bool bVar2;
  bool isNumericSeparatorEnabled;
  OLECHAR OVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ScriptConfiguration *pSVar6;
  uchar *puVar7;
  double dVar8;
  double *local_c0;
  uint local_74;
  double *pdStack_70;
  codepoint_t outChar;
  EncodedCharPtr startingLocation;
  anon_class_32_4_6bd5a30f baseSpecifierCheck;
  double *pdStack_40;
  bool baseSpecified;
  EncodedCharPtr pchT;
  EncodedCharPtr last;
  size_t savedMultiUnits_local;
  LikelyNumberType *likelyType_local;
  double *pdbl_local;
  EncodedCharPtr p_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  pchT = this->m_pchLast;
  pdStack_40 = (double *)0x0;
  baseSpecifierCheck.baseSpecified._7_1_ = 0;
  *likelyType = Int;
  this->field_0x508 = this->field_0x508 & 0xfb;
  startingLocation = (EncodedCharPtr)&stack0xffffffffffffffc0;
  baseSpecifierCheck.pchT = (EncodedCharPtr *)&likelyType_local;
  baseSpecifierCheck.p = (EncodedCharPtr)((long)&baseSpecifierCheck.baseSpecified + 7);
  baseSpecifierCheck.pdbl = (double **)p;
  last = (EncodedCharPtr)savedMultiUnits;
  savedMultiUnits_local = (size_t)likelyType;
  likelyType_local = (LikelyNumberType *)pdbl;
  pdbl_local = (double *)p;
  p_local = (EncodedCharPtr)this;
  OVar3 = UTF8EncodingPolicyBase<false>::PeekFirst(p,pchT);
  if (OVar3 != L'0') goto LAB_015f14a0;
  OVar3 = UTF8EncodingPolicyBase<false>::PeekFirst((EncodedCharPtr)((long)pdbl_local + 1),pchT);
  switch(OVar3) {
  case L'.':
  case L'E':
  case L'e':
  case L'n':
    *(undefined4 *)savedMultiUnits_local = 0;
    goto LAB_015f14a0;
  default:
    dVar8 = Js::NumberUtilities::DblFromOctal<unsigned_char>
                      ((uchar *)pdbl_local,(uchar **)&stack0xffffffffffffffc0,false);
    *(double *)likelyType_local = dVar8;
    if (pdStack_40 <= pdbl_local) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x295,"(pchT > p)","pchT > p");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if (((*(double *)likelyType_local != 0.0) || (NAN(*(double *)likelyType_local))) ||
       ((double *)((long)pdbl_local + 1) < pdStack_40)) {
      this->field_0x508 = this->field_0x508 & 0xfb | 4;
    }
    if (*(byte *)pdStack_40 != 0x38 && *(byte *)pdStack_40 != 0x39) break;
    this->field_0x508 = this->field_0x508 & 0xfb;
LAB_015f14a0:
    psz = pdbl_local;
    likelyNumberType = savedMultiUnits_local;
    pSVar6 = Js::ScriptContext::GetConfig(this->m_scriptContext);
    bVar2 = Js::ScriptConfiguration::IsESBigIntEnabled(pSVar6);
    pSVar6 = Js::ScriptContext::GetConfig(this->m_scriptContext);
    isNumericSeparatorEnabled = Js::ScriptConfiguration::IsESNumericSeparatorEnabled(pSVar6);
    dVar8 = Js::NumberUtilities::StrToDbl<unsigned_char>
                      ((uchar *)psz,(uchar **)&stack0xffffffffffffffc0,
                       (LikelyNumberType *)likelyNumberType,bVar2,isNumericSeparatorEnabled);
    *(double *)likelyType_local = dVar8;
    if ((pdStack_40 != pdbl_local) &&
       (bVar2 = Js::NumberUtilities::IsNan(*(double *)likelyType_local), bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x2ae,"(pchT == p || !Js::NumberUtilities::IsNan(*pdbl))",
                         "pchT == p || !Js::NumberUtilities::IsNan(*pdbl)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((*(int *)savedMultiUnits_local == 2) &&
       ((*(double *)likelyType_local != 0.0 || (NAN(*(double *)likelyType_local))))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x2b1,"(*pdbl == 0)","*pdbl == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    break;
  case L'B':
  case L'b':
    puVar7 = (uchar *)((long)pdbl_local + 2);
    pSVar6 = Js::ScriptContext::GetConfig(this->m_scriptContext);
    bVar2 = Js::ScriptConfiguration::IsESNumericSeparatorEnabled(pSVar6);
    dVar8 = Js::NumberUtilities::DblFromBinary<unsigned_char>
                      (puVar7,(uchar **)&stack0xffffffffffffffc0,bVar2);
    *(double *)likelyType_local = dVar8;
    FScanNumber::anon_class_32_4_6bd5a30f::operator()((anon_class_32_4_6bd5a30f *)&startingLocation)
    ;
    break;
  case L'O':
  case L'o':
    puVar7 = (uchar *)((long)pdbl_local + 2);
    pSVar6 = Js::ScriptContext::GetConfig(this->m_scriptContext);
    bVar2 = Js::ScriptConfiguration::IsESNumericSeparatorEnabled(pSVar6);
    dVar8 = Js::NumberUtilities::DblFromOctal<unsigned_char>
                      (puVar7,(uchar **)&stack0xffffffffffffffc0,bVar2);
    *(double *)likelyType_local = dVar8;
    FScanNumber::anon_class_32_4_6bd5a30f::operator()((anon_class_32_4_6bd5a30f *)&startingLocation)
    ;
    break;
  case L'X':
  case L'x':
    puVar7 = (uchar *)((long)pdbl_local + 2);
    pSVar6 = Js::ScriptContext::GetConfig(this->m_scriptContext);
    bVar2 = Js::ScriptConfiguration::IsESNumericSeparatorEnabled(pSVar6);
    dVar8 = Js::NumberUtilities::DblFromHex<unsigned_char>
                      (puVar7,(uchar **)&stack0xffffffffffffffc0,bVar2);
    *(double *)likelyType_local = dVar8;
    FScanNumber::anon_class_32_4_6bd5a30f::operator()((anon_class_32_4_6bd5a30f *)&startingLocation)
    ;
  }
  if ((baseSpecifierCheck.baseSpecified._7_1_ & 1) == 0) {
    local_c0 = pdStack_40;
  }
  else {
    local_c0 = (double *)((long)pdStack_40 + 1);
  }
  pdStack_70 = local_c0;
  local_74 = (uint)*(byte *)local_c0;
  BVar4 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar((ushort)*(byte *)local_c0);
  if (BVar4 != 0) {
    OVar3 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                      (&this->super_UTF8EncodingPolicyBase<false>,(OLECHAR)local_74,
                       (EncodedCharPtr *)&stack0xffffffffffffff90,pchT);
    local_74 = (uint)(ushort)OVar3;
  }
  bVar2 = Js::CharClassifier::IsIdStart(this->charClassifier,local_74);
  if (bVar2) {
    UTF8EncodingPolicyBase<false>::RestoreMultiUnits
              (&this->super_UTF8EncodingPolicyBase<false>,(size_t)last);
    Error(this,-0x7ff5fc07);
  }
  if (*(byte *)pdStack_40 == 0x5c) {
    pdStack_70 = (double *)((long)pdStack_70 + 1);
    bVar2 = TryReadEscape(this,(EncodedCharPtr *)&stack0xffffffffffffff90,this->m_pchLast,&local_74)
    ;
    if (bVar2) {
      UTF8EncodingPolicyBase<false>::RestoreMultiUnits
                (&this->super_UTF8EncodingPolicyBase<false>,(size_t)last);
      Error(this,-0x7ff5fc07);
    }
  }
  bVar2 = Js::NumberUtilities::IsDigit((uint)*(byte *)pdStack_70);
  if (!bVar2) {
    return (EncodedCharPtr)pdStack_40;
  }
  UTF8EncodingPolicyBase<false>::RestoreMultiUnits
            (&this->super_UTF8EncodingPolicyBase<false>,(size_t)last);
  Error(this,-0x7ff5fc0b);
}

Assistant:

typename Scanner<EncodingPolicy>::EncodedCharPtr Scanner<EncodingPolicy>::FScanNumber(EncodedCharPtr p, double *pdbl, LikelyNumberType& likelyType, size_t savedMultiUnits)
{
    EncodedCharPtr last = m_pchLast;
    EncodedCharPtr pchT = nullptr;
    bool baseSpecified = false;
    likelyType = LikelyNumberType::Int;
    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;

    auto baseSpecifierCheck = [&pchT, &pdbl, p, &baseSpecified]()
    {
        if (pchT == p + 2)
        {
            // An octal token '0' was followed by a base specifier: /0[xXoObB]/
            // This literal can no longer be a double
            *pdbl = 0;
            // Advance the character pointer to the base specifier
            pchT = p + 1;
            // Set the flag so we know to offset the potential identifier search after the literal
            baseSpecified = true;
        }
    };

    if ('0' == this->PeekFirst(p, last))
    {
        switch(this->PeekFirst(p + 1, last))
        {
        case '.':
        case 'e':
        case 'E':
        case 'n':
            likelyType = LikelyNumberType::Double;
            // Floating point
            goto LFloat;

        case 'x':
        case 'X':
            // Hex
            *pdbl = Js::NumberUtilities::DblFromHex(p + 2, &pchT, m_scriptContext->GetConfig()->IsESNumericSeparatorEnabled());
            baseSpecifierCheck();
            goto LIdCheck;
        case 'o':
        case 'O':
            // Octal
            *pdbl = Js::NumberUtilities::DblFromOctal(p + 2, &pchT, m_scriptContext->GetConfig()->IsESNumericSeparatorEnabled());
            baseSpecifierCheck();
            goto LIdCheck;

        case 'b':
        case 'B':
            // Binary
            *pdbl = Js::NumberUtilities::DblFromBinary(p + 2, &pchT, m_scriptContext->GetConfig()->IsESNumericSeparatorEnabled());
            baseSpecifierCheck();
            goto LIdCheck;

        default:
            // Octal
            *pdbl = Js::NumberUtilities::DblFromOctal(p, &pchT);
            Assert(pchT > p);

#if !SOURCERELEASE
            // If an octal literal is malformed then it is in fact a decimal literal.
#endif // !SOURCERELEASE
            if(*pdbl != 0 || pchT > p + 1)
                m_OctOrLeadingZeroOnLastTKNumber = true; //report as an octal or hex for JSON when leading 0. Just '0' is ok

            switch (*pchT)
            {
            case '8':
            case '9':
                //            case 'e':
                //            case 'E':
                //            case '.':
                m_OctOrLeadingZeroOnLastTKNumber = false;  //08...  or 09....
                goto LFloat;
            }
            goto LIdCheck;
        }
    }
    else
    {
LFloat:
        *pdbl = Js::NumberUtilities::StrToDbl(p, &pchT, likelyType, m_scriptContext->GetConfig()->IsESBigIntEnabled(), m_scriptContext->GetConfig()->IsESNumericSeparatorEnabled());
        Assert(pchT == p || !Js::NumberUtilities::IsNan(*pdbl));
        if (likelyType == LikelyNumberType::BigInt)
        {
            Assert(*pdbl == 0);
        }
        // fall through to LIdCheck
    }

LIdCheck:
    // https://tc39.github.io/ecma262/#sec-literals-numeric-literals
    // The SourceCharacter immediately following a NumericLiteral must not be an IdentifierStart or DecimalDigit.
    // For example : 3in is an error and not the two input elements 3 and in
    // If a base was speficied, use the first character denoting the constant. In this case, pchT is pointing to the base specifier.
    EncodedCharPtr startingLocation = baseSpecified ? pchT + 1 : pchT;
    codepoint_t outChar = *startingLocation;
    if (this->IsMultiUnitChar((OLECHAR)outChar))
    {
        outChar = this->template ReadRest<true>((OLECHAR)outChar, startingLocation, last);
    }
    if (this->charClassifier->IsIdStart(outChar))
    {
        this->RestoreMultiUnits(savedMultiUnits);
        Error(ERRIdAfterLit);
    }

    // IsIdStart does not cover the unicode escape case. Try to read a unicode escape from the 'u' char.
    if (*pchT == '\\')
    {
        startingLocation++; // TryReadEscape expects us to point to the 'u', and since it is by reference we need to do it beforehand.
        if (TryReadEscape(startingLocation, m_pchLast, &outChar))
        {
            this->RestoreMultiUnits(savedMultiUnits);
            Error(ERRIdAfterLit);
        }
    }

    if (Js::NumberUtilities::IsDigit(*startingLocation))
    {
        this->RestoreMultiUnits(savedMultiUnits);
        Error(ERRbadNumber);
    }

    return pchT;
}